

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O2

void slider_dialog(t_slider *x,t_symbol *s,int argc,t_atom *argv)

{
  _glist *canvas;
  int iVar1;
  t_symbol *s_00;
  int iVar2;
  int iVar3;
  t_float tVar4;
  t_float tVar5;
  t_float tVar6;
  t_float tVar7;
  t_float tVar8;
  t_float tVar9;
  ulong uVar10;
  t_symbol *srl [3];
  t_atom undo [18];
  
  tVar4 = atom_getfloatarg(0,argc,argv);
  tVar5 = atom_getfloatarg(1,argc,argv);
  tVar6 = atom_getfloatarg(2,argc,argv);
  tVar7 = atom_getfloatarg(3,argc,argv);
  tVar8 = atom_getfloatarg(4,argc,argv);
  tVar9 = atom_getfloatarg(0x11,argc,argv);
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  iVar2 = 1;
  iVar3 = iVar1;
  if (x->x_orientation != horizontal) {
    iVar3 = iVar2;
    iVar2 = iVar1;
  }
  iemgui_setdialogatoms(&x->x_gui,0x12,undo);
  undo[2].a_type = A_FLOAT;
  undo[2].a_w._0_4_ = (undefined4)x->x_min;
  undo[3].a_w._0_4_ = (undefined4)x->x_max;
  undo[4].a_w._0_4_ = (undefined4)x->x_lin0_log1;
  undo[0x11].a_w._0_4_ = (undefined4)x->x_steady;
  canvas = (x->x_gui).x_glist;
  undo[3].a_type = undo[2].a_type;
  undo[4].a_type = undo[2].a_type;
  undo[0x11].a_type = undo[2].a_type;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(canvas,(t_pd *)x,s_00,0x12,undo,argc,argv);
  uVar10 = ~CONCAT44(-(uint)((int)tVar9 == 0),-(uint)((int)tVar8 == 0)) & (ulong)DAT_001a7de0;
  x->x_lin0_log1 = (int)uVar10;
  x->x_steady = (int)(uVar10 >> 0x20);
  iemgui_dialog(&x->x_gui,srl,argc,argv);
  if (x->x_orientation == horizontal) {
    iVar1 = iemgui_clip_size(iVar2 * (int)tVar5);
    (x->x_gui).x_h = iVar1 * ((x->x_gui).x_glist)->gl_zoom;
    iVar1 = slider_check_range(x,iVar3 * (int)tVar4);
    (x->x_gui).x_w = iVar1;
  }
  else {
    iVar1 = slider_check_range(x,iVar2 * (int)tVar5);
    (x->x_gui).x_h = iVar1;
    iVar1 = iemgui_clip_size(iVar3 * (int)tVar4);
    (x->x_gui).x_w = iVar1 * ((x->x_gui).x_glist)->gl_zoom;
    iVar1 = (x->x_gui).x_h;
  }
  slider_check_minmax(x,(double)tVar6,(double)tVar7,(float)iVar1);
  iemgui_size(x,&x->x_gui);
  slider_set(x,x->x_fval);
  return;
}

Assistant:

static void slider_dialog(t_slider *x, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *srl[3];
    int w = (int)atom_getfloatarg(0, argc, argv);
    int h = (int)atom_getfloatarg(1, argc, argv);
    double min = (double)atom_getfloatarg(2, argc, argv);
    double max = (double)atom_getfloatarg(3, argc, argv);
    int lilo = (int)atom_getfloatarg(4, argc, argv);
    int steady = (int)atom_getfloatarg(17, argc, argv);
    int sr_flags;
    t_atom undo[18];

    if(x->x_orientation == horizontal)
        w *= IEMGUI_ZOOM(x);
    else
        h *= IEMGUI_ZOOM(x);

    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT(undo+2, x->x_min);
    SETFLOAT(undo+3, x->x_max);
    SETFLOAT(undo+4, x->x_lin0_log1);
    SETFLOAT(undo+17, x->x_steady);

    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    x->x_lin0_log1 = !!lilo;
    x->x_steady = !!steady;

    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);

    if(x->x_orientation == horizontal)
    {
        x->x_gui.x_h = iemgui_clip_size(h) * IEMGUI_ZOOM(x);
        x->x_gui.x_w = slider_check_range(x, w);
        slider_check_minmax(x, min, max, x->x_gui.x_w);
    } else {
        x->x_gui.x_h = slider_check_range(x, h);
        x->x_gui.x_w = iemgui_clip_size(w) * IEMGUI_ZOOM(x);
        slider_check_minmax(x, min, max, x->x_gui.x_h);
    }

    iemgui_size(x, &x->x_gui);
    slider_set(x, x->x_fval);
}